

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int __thiscall
icu_63::UnicodeSet::clone
          (UnicodeSet *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UnicodeSet *this_00;
  undefined8 local_30;
  UnicodeSet *this_local;
  
  this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)__fn);
  local_30 = (UnicodeSet *)0x0;
  if (this_00 != (UnicodeSet *)0x0) {
    UnicodeSet(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

UnicodeFunctor* UnicodeSet::clone() const {
    return new UnicodeSet(*this);
}